

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pillar.cpp
# Opt level: O0

bool EV_DoPillar(EPillar type,line_t *line,int tag,double speed,double height,double height2,
                int crush,bool hexencrush)

{
  bool bVar1;
  int iVar2;
  DPillar *this;
  size_t len;
  double dVar3;
  double dVar4;
  double ceil;
  double flor;
  FSectorTagIterator itr;
  bool rtn;
  sector_t *sec;
  int secnum;
  bool hexencrush_local;
  int crush_local;
  double height2_local;
  double height_local;
  double speed_local;
  int tag_local;
  line_t *line_local;
  EPillar type_local;
  
  itr.searchtag._3_1_ = 0;
  FSectorTagIterator::FSectorTagIterator((FSectorTagIterator *)((long)&flor + 4),tag,line);
LAB_006a2e73:
  do {
    do {
      iVar2 = FSectorTagIterator::Next((FSectorTagIterator *)((long)&flor + 4));
      if (iVar2 < 0) {
        return (bool)(itr.searchtag._3_1_ & 1);
      }
      register0x00000000 = sectors + iVar2;
      bVar1 = sector_t::PlaneMoving(register0x00000000,0);
    } while (bVar1);
    len = 1;
    bVar1 = sector_t::PlaneMoving(stack0xffffffffffffffb0,1);
  } while (bVar1);
  dVar3 = sector_t::CenterFloor(stack0xffffffffffffffb0);
  dVar4 = sector_t::CenterCeiling(stack0xffffffffffffffb0);
  if (type == pillarBuild) goto code_r0x006a2eeb;
  goto LAB_006a2efe;
code_r0x006a2eeb:
  if ((dVar3 != dVar4) || (NAN(dVar3) || NAN(dVar4))) {
LAB_006a2efe:
    if ((type != pillarOpen) || ((dVar3 == dVar4 && (!NAN(dVar3) && !NAN(dVar4))))) {
      itr.searchtag._3_1_ = 1;
      this = (DPillar *)DObject::operator_new((DObject *)0x88,len);
      DPillar::DPillar(this,stack0xffffffffffffffb0,type,speed,height,height2,crush,hexencrush);
    }
  }
  goto LAB_006a2e73;
}

Assistant:

bool EV_DoPillar (DPillar::EPillar type, line_t *line, int tag,
				  double speed, double height, double height2, int crush, bool hexencrush)
{
	int secnum;
	sector_t *sec;
	bool rtn = false;

	// check if a manual trigger; if so do just the sector on the backside
	FSectorTagIterator itr(tag, line);
	while ((secnum = itr.Next()) >= 0)
	{
		sec = &sectors[secnum];

		if (sec->PlaneMoving(sector_t::floor) || sec->PlaneMoving(sector_t::ceiling))
			continue;

		double flor, ceil;

		flor = sec->CenterFloor ();
		ceil = sec->CenterCeiling ();

		if (type == DPillar::pillarBuild && flor == ceil)
			continue;

		if (type == DPillar::pillarOpen && flor != ceil)
			continue;

		rtn = true;
		new DPillar (sec, type, speed, height, height2, crush, hexencrush);
	}
	return rtn;
}